

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surface_mesh.cpp
# Opt level: O2

void __thiscall
polyscope::SurfaceMeshQuantity::SurfaceMeshQuantity
          (SurfaceMeshQuantity *this,string *name,SurfaceMesh *parentStructure,bool dominates)

{
  string local_40;
  
  std::__cxx11::string::string((string *)&local_40,(string *)name);
  QuantityS<polyscope::SurfaceMesh>::QuantityS
            (&this->super_QuantityS<polyscope::SurfaceMesh>,&local_40,parentStructure,dominates);
  std::__cxx11::string::~string((string *)&local_40);
  (this->super_QuantityS<polyscope::SurfaceMesh>).super_Quantity._vptr_Quantity =
       (_func_int **)&PTR__Quantity_00596838;
  return;
}

Assistant:

SurfaceMeshQuantity::SurfaceMeshQuantity(std::string name, SurfaceMesh& parentStructure, bool dominates)
    : QuantityS<SurfaceMesh>(name, parentStructure, dominates) {}